

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_AppStoreReceipt.cpp
# Opt level: O1

void __thiscall axl::cry::AppStoreReceipt::clear(AppStoreReceipt *this)

{
  BufHdr *pBVar1;
  
  pBVar1 = (this->m_bundleId).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_hdr;
  if (pBVar1 != (BufHdr *)0x0) {
    if ((pBVar1->super_RefCount).m_refCount == 1) {
      (this->m_bundleId).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_p =
           (C *)(pBVar1 + 1);
      *(undefined1 *)&pBVar1[1].super_RefCount._vptr_RefCount = 0;
      (this->m_bundleId).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_length = 0;
    }
    else {
      sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release
                ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)this);
    }
  }
  pBVar1 = (this->m_appVersion).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_hdr;
  if (pBVar1 != (BufHdr *)0x0) {
    if ((pBVar1->super_RefCount).m_refCount == 1) {
      (this->m_appVersion).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_p =
           (C *)(pBVar1 + 1);
      *(undefined1 *)&pBVar1[1].super_RefCount._vptr_RefCount = 0;
      (this->m_appVersion).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_length = 0
      ;
    }
    else {
      sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release
                (&(this->m_appVersion).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>)
      ;
    }
  }
  pBVar1 = (this->m_originalAppVersion).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>
           .m_hdr;
  if (pBVar1 != (BufHdr *)0x0) {
    if ((pBVar1->super_RefCount).m_refCount == 1) {
      (this->m_originalAppVersion).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_p
           = (C *)(pBVar1 + 1);
      *(undefined1 *)&pBVar1[1].super_RefCount._vptr_RefCount = 0;
      (this->m_originalAppVersion).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.
      m_length = 0;
    }
    else {
      sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release
                (&(this->m_originalAppVersion).
                  super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
    }
  }
  pBVar1 = (this->m_receiptCreationDateString).
           super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_hdr;
  if (pBVar1 != (BufHdr *)0x0) {
    if ((pBVar1->super_RefCount).m_refCount == 1) {
      (this->m_receiptCreationDateString).
      super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_p = (C *)(pBVar1 + 1);
      *(undefined1 *)&pBVar1[1].super_RefCount._vptr_RefCount = 0;
      (this->m_receiptCreationDateString).
      super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_length = 0;
    }
    else {
      sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release
                (&(this->m_receiptCreationDateString).
                  super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
    }
  }
  pBVar1 = (this->m_receiptExpirationDateString).
           super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_hdr;
  if (pBVar1 != (BufHdr *)0x0) {
    if ((pBVar1->super_RefCount).m_refCount == 1) {
      (this->m_receiptExpirationDateString).
      super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_p = (C *)(pBVar1 + 1);
      *(undefined1 *)&pBVar1[1].super_RefCount._vptr_RefCount = 0;
      (this->m_receiptExpirationDateString).
      super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_length = 0;
    }
    else {
      sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release
                (&(this->m_receiptExpirationDateString).
                  super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
    }
  }
  this->m_receiptCreationTimestamp = 0;
  this->m_receiptExpirationTimestamp = 0;
  sl::Array<char,_axl::sl::ArrayDetails<char>_>::
  setCountImpl<axl::sl::SimpleArrayDetails<char>::Construct>(&this->m_opaque,0);
  sl::Array<char,_axl::sl::ArrayDetails<char>_>::
  setCountImpl<axl::sl::SimpleArrayDetails<char>::Construct>(&this->m_sha1Hash,0);
  return;
}

Assistant:

void
AppStoreReceipt::clear() {
	m_bundleId.clear();
	m_appVersion.clear();
	m_originalAppVersion.clear();
	m_receiptCreationDateString.clear();
	m_receiptExpirationDateString.clear();
	m_receiptCreationTimestamp = 0;
	m_receiptExpirationTimestamp = 0;
	m_opaque.clear();
	m_sha1Hash.clear();
}